

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O0

void __thiscall
Centaurus::CompositeATN<unsigned_char>::build_closure_inclusive
          (CompositeATN<unsigned_char> *this,CATNClosure *closure,ATNPath *path,int color,
          ATNStateStack *stack,PriorityChain *priority)

{
  ATNPath *pAVar1;
  ATNPath *closure_00;
  bool bVar2;
  int iVar3;
  Identifier *pIVar4;
  SimpleException *this_00;
  pair<std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>,_bool> pVar5;
  ATNPath local_a8;
  undefined1 local_85;
  allocator local_71;
  string local_70;
  _Base_ptr local_50;
  undefined1 local_48;
  CATNNode<unsigned_char> *local_40;
  CATNNode<unsigned_char> *node;
  PriorityChain *priority_local;
  ATNStateStack *stack_local;
  ATNPath *pAStack_20;
  int color_local;
  ATNPath *path_local;
  CATNClosure *closure_local;
  CompositeATN<unsigned_char> *this_local;
  
  node = (CATNNode<unsigned_char> *)priority;
  priority_local = (PriorityChain *)stack;
  stack_local._4_4_ = color;
  pAStack_20 = path;
  path_local = (ATNPath *)closure;
  closure_local = (CATNClosure *)this;
  local_40 = get_node(this,path);
  bVar2 = CATNNode<unsigned_char>::is_terminal(local_40);
  pAVar1 = pAStack_20;
  if (bVar2) {
    pVar5 = std::
            set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
            ::emplace<Centaurus::ATNPath_const&,int&,Centaurus::PriorityChain_const&>
                      ((set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
                        *)path_local,pAStack_20,(int *)((long)&stack_local + 4),
                       (PriorityChain *)node);
    local_50 = (_Base_ptr)pVar5.first._M_node;
    local_48 = pVar5.second;
    build_closure_exclusive
              (this,(CATNClosure *)path_local,pAStack_20,stack_local._4_4_,
               (ATNStateStack *)priority_local,(PriorityChain *)node);
  }
  else {
    pIVar4 = ATNPath::leaf_id(pAStack_20);
    iVar3 = ATNPath::leaf_index(pAStack_20);
    iVar3 = ATNPath::count(pAVar1,pIVar4,iVar3);
    closure_00 = path_local;
    pAVar1 = pAStack_20;
    if (1 < iVar3) {
      local_85 = 1;
      this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_70,"Downward sentinel reached.",&local_71);
      SimpleException::SimpleException(this_00,&local_70);
      local_85 = 0;
      __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
    }
    pIVar4 = CATNNode<unsigned_char>::get_submachine(local_40);
    ATNPath::add(&local_a8,pAVar1,pIVar4,0);
    build_closure_inclusive
              (this,(CATNClosure *)closure_00,&local_a8,stack_local._4_4_,
               (ATNStateStack *)priority_local,(PriorityChain *)node);
    ATNPath::~ATNPath(&local_a8);
  }
  return;
}

Assistant:

void CompositeATN<TCHAR>::build_closure_inclusive(CATNClosure& closure, const ATNPath& path, int color, ATNStateStack& stack, const PriorityChain& priority) const
{
    const CATNNode<TCHAR>& node = get_node(path);

    if (node.is_terminal())
    {
        closure.emplace(path, color, priority);

        build_closure_exclusive(closure, path, color, stack, priority);
    }
    else
    {
        if (path.count(path.leaf_id(), path.leaf_index()) >= 2)
        {
            throw SimpleException("Downward sentinel reached.");
        }
        build_closure_inclusive(closure, path.add(node.get_submachine(), 0), color, stack, priority);
    }
}